

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic.c
# Opt level: O3

int check_ans(N_Vector y,sunrealtype t,sunrealtype rtol,sunrealtype atol)

{
  double dVar1;
  
  dVar1 = atan(t);
  dVar1 = ABS(**(double **)((long)y->content + 0x10) - dVar1) * (1.0 / (ABS(dVar1) * 1e-05 + 1e-10))
  ;
  if (1.5 <= dVar1) {
    fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n",dVar1);
  }
  return (int)(1.5 <= dVar1);
}

Assistant:

static int check_ans(N_Vector y, sunrealtype t, sunrealtype rtol, sunrealtype atol)
{
  int passfail = 0;          /* answer pass (0) or fail (1) flag     */
  sunrealtype ans, err, ewt; /* answer data, error, and error weight */

  /* compute solution error */
  ans = atan(t);
  ewt = SUN_RCONST(1.0) / (rtol * SUNRabs(ans) + atol);
  err = ewt * SUNRabs(NV_Ith_S(y, 0) - ans);

  /* The local errors accumulate from step to step so that the global error is
   * not quite within the local error tolerances. This factor accounts for
   * this. */
  sunrealtype global_bound = SUN_RCONST(1.5);

  /* is the solution within the tolerances? */
  passfail = (err < global_bound) ? 0 : 1;

  if (passfail)
  {
    fprintf(stdout, "\nSUNDIALS_WARNING: check_ans error=%" GSYM "\n\n", err);
  }

  return (passfail);
}